

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_im2col_gemm.h
# Opt level: O0

void ncnn::convolution_im2col_gemm_transform_kernel
               (Mat *kernel,Mat *AT,int inch,int outch,int kernel_w,int kernel_h,Option *opt)

{
  int *piVar1;
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  int in_R8D;
  int in_R9D;
  long in_stack_00000008;
  Mat AT_tile;
  int max_kk;
  int k_1;
  int max_ii;
  int i_1;
  int ppj;
  float *k00;
  int i;
  int k;
  int p;
  float *g00;
  int q;
  Mat weight_data_r2;
  Mat A_data;
  int elempack;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  int K;
  int M;
  int maxk;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_fffffffffffff9f8;
  Allocator *in_stack_fffffffffffffa00;
  void **ppvVar2;
  int in_stack_fffffffffffffa08;
  int in_stack_fffffffffffffa0c;
  Mat *in_stack_fffffffffffffa10;
  int _c;
  undefined8 in_stack_fffffffffffffa18;
  Mat *in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa40;
  undefined4 in_stack_fffffffffffffa44;
  int *in_stack_fffffffffffffa48;
  int *in_stack_fffffffffffffa50;
  undefined8 in_stack_fffffffffffffa58;
  undefined8 in_stack_fffffffffffffa60;
  int in_stack_fffffffffffffa70;
  Allocator *in_stack_fffffffffffffa88;
  void **ppvVar3;
  undefined8 in_stack_fffffffffffffa90;
  Mat *in_stack_fffffffffffffa98;
  int local_558;
  int local_554;
  undefined8 local_550;
  undefined8 local_548;
  undefined8 local_540;
  undefined4 local_538;
  long *local_530;
  undefined4 local_528;
  undefined4 local_524;
  undefined4 local_520;
  undefined4 local_51c;
  undefined4 local_518;
  undefined8 local_510;
  void *local_508;
  Allocator *in_stack_fffffffffffffb00;
  int in_stack_fffffffffffffb0c;
  int in_stack_fffffffffffffb10;
  int in_stack_fffffffffffffb14;
  Mat *in_stack_fffffffffffffb18;
  long *plVar4;
  int local_4bc;
  int local_4b8;
  int local_4b4;
  int local_4b0;
  int local_4ac;
  int local_4a8;
  int local_4a4;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined4 local_478;
  undefined4 local_46c;
  undefined8 local_460;
  void *local_458;
  int local_44c;
  int local_448;
  int local_444;
  undefined4 *local_440;
  int local_434;
  void *local_430;
  int *local_428;
  long local_420;
  long *local_410;
  int local_404;
  int local_400;
  long local_3f0;
  void *local_3d8;
  int *local_3d0;
  long *local_3b8;
  void *local_390;
  int *local_388;
  long local_380;
  undefined4 local_378;
  long *local_370;
  undefined4 local_368;
  int local_364;
  undefined4 local_360;
  undefined4 local_35c;
  undefined4 local_358;
  undefined8 local_350;
  int local_348;
  int local_344;
  int local_340 [2];
  int local_338;
  int local_334;
  int local_330;
  int local_32c;
  int local_320;
  int local_31c;
  long *local_318;
  void **local_308;
  void **local_300;
  undefined8 *local_2f0;
  void **local_2e8;
  undefined8 *local_2d8;
  void **local_2c8;
  void **local_2b8;
  int local_2a8;
  undefined4 local_2a4;
  void **local_2a0;
  void **local_298;
  void **local_290;
  int local_288;
  undefined4 local_284;
  void **local_280;
  int local_268;
  undefined4 local_264;
  void **local_260;
  int local_248;
  undefined4 local_244;
  void **local_240;
  undefined8 *local_220;
  int local_208;
  undefined4 local_204;
  void **local_200;
  undefined8 *local_1f0;
  int local_1d8;
  undefined4 local_1d4;
  void **local_1d0;
  undefined1 local_1c5;
  int local_1c4;
  undefined8 *local_1b8;
  undefined1 local_195;
  int local_194;
  void **local_190;
  undefined8 *local_188;
  void *local_120;
  void *local_110;
  void *local_100;
  int local_f4;
  undefined8 *local_f0;
  int local_e4;
  void **local_e0;
  undefined4 local_d8;
  int local_d4;
  undefined8 *local_d0;
  void **local_c8;
  long *local_c0;
  undefined4 local_b4;
  long local_b0;
  void *local_a8;
  undefined4 local_a0;
  int local_9c;
  void **local_98;
  void *local_78;
  undefined8 *local_60;
  long *local_58;
  undefined4 local_4c;
  long local_48;
  long local_40;
  undefined4 local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_32c = in_R8D * in_R9D;
  local_334 = in_EDX * local_32c;
  local_330 = in_ECX;
  local_320 = in_ECX;
  local_31c = in_EDX;
  local_318 = in_RSI;
  convolution_im2col_gemm_get_optimal_tile_mnk
            ((int)((ulong)in_stack_fffffffffffffa60 >> 0x20),(int)in_stack_fffffffffffffa60,
             (int)((ulong)in_stack_fffffffffffffa58 >> 0x20),in_stack_fffffffffffffa50,
             in_stack_fffffffffffffa48,
             (int *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
             in_stack_fffffffffffffa70);
  local_344 = (local_330 + local_338 + -1) / local_338;
  local_348 = 1;
  if ((*(byte *)(in_stack_00000008 + 0x27) & 1) != 0) {
    if (local_31c % 0x10 == 0) {
      local_554 = 0x10;
    }
    else {
      if (local_31c % 8 == 0) {
        local_558 = 8;
      }
      else {
        local_558 = 1;
        if (local_31c % 4 == 0) {
          local_558 = 4;
        }
      }
      local_554 = local_558;
    }
    local_348 = local_554;
  }
  local_308 = &local_390;
  local_390 = (void *)0x0;
  local_388 = (int *)0x0;
  local_380 = 0;
  local_378 = 0;
  local_370 = (long *)0x0;
  local_368 = 0;
  local_364 = 0;
  local_360 = 0;
  local_35c = 0;
  local_358 = 0;
  local_350 = 0;
  if (local_32c == 1) {
    Mat::reshape(in_stack_fffffffffffffa98,(int)((ulong)in_stack_fffffffffffffa90 >> 0x20),
                 (int)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88);
    _c = (int)((ulong)in_stack_fffffffffffffa10 >> 0x20);
    ppvVar2 = &local_390;
    local_2a0 = &local_3d8;
    local_298 = ppvVar2;
    if (ppvVar2 != local_2a0) {
      if (local_3d0 != (int *)0x0) {
        local_2a4 = 1;
        LOCK();
        local_2a8 = *local_3d0;
        *local_3d0 = *local_3d0 + 1;
        UNLOCK();
      }
      ppvVar3 = ppvVar2;
      local_280 = ppvVar2;
      if (local_388 != (int *)0x0) {
        local_284 = 0xffffffff;
        LOCK();
        local_288 = *local_388;
        *local_388 = *local_388 + -1;
        UNLOCK();
        if (local_288 == 1) {
          if (local_370 == (long *)0x0) {
            local_100 = local_390;
            if (local_390 != (void *)0x0) {
              free(local_390);
            }
          }
          else {
            (**(code **)(*local_370 + 0x18))(local_370,local_390);
          }
        }
      }
      *ppvVar2 = (void *)0x0;
      ppvVar2[2] = (void *)0x0;
      *(undefined4 *)(ppvVar2 + 3) = 0;
      *(undefined4 *)(ppvVar2 + 5) = 0;
      *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
      *(undefined4 *)(ppvVar2 + 6) = 0;
      *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
      *(undefined4 *)(ppvVar2 + 7) = 0;
      ppvVar2[8] = (void *)0x0;
      ppvVar2[1] = (void *)0x0;
      *ppvVar3 = *local_2a0;
      ppvVar3[1] = local_2a0[1];
      ppvVar3[2] = local_2a0[2];
      *(undefined4 *)(ppvVar3 + 3) = *(undefined4 *)(local_2a0 + 3);
      ppvVar3[4] = local_2a0[4];
      *(undefined4 *)(ppvVar3 + 5) = *(undefined4 *)(local_2a0 + 5);
      *(undefined4 *)((long)ppvVar3 + 0x2c) = *(undefined4 *)((long)local_2a0 + 0x2c);
      *(undefined4 *)(ppvVar3 + 6) = *(undefined4 *)(local_2a0 + 6);
      *(undefined4 *)((long)ppvVar3 + 0x34) = *(undefined4 *)((long)local_2a0 + 0x34);
      *(undefined4 *)(ppvVar3 + 7) = *(undefined4 *)(local_2a0 + 7);
      ppvVar3[8] = local_2a0[8];
      ppvVar2 = ppvVar3;
    }
    ppvVar3 = &local_3d8;
    local_300 = ppvVar3;
    local_290 = ppvVar2;
    local_1d0 = ppvVar3;
    if (local_3d0 != (int *)0x0) {
      local_1d4 = 0xffffffff;
      LOCK();
      local_1d8 = *local_3d0;
      *local_3d0 = *local_3d0 + -1;
      UNLOCK();
      if (local_1d8 == 1) {
        if (local_3b8 == (long *)0x0) {
          if (local_3d8 != (void *)0x0) {
            free(local_3d8);
          }
        }
        else {
          (**(code **)(*local_3b8 + 0x18))(local_3b8,local_3d8);
        }
      }
    }
    *ppvVar3 = (void *)0x0;
    ppvVar3[2] = (void *)0x0;
    *(undefined4 *)(ppvVar3 + 3) = 0;
    *(undefined4 *)(ppvVar3 + 5) = 0;
    *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
    *(undefined4 *)(ppvVar3 + 6) = 0;
    *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
    *(undefined4 *)(ppvVar3 + 7) = 0;
    ppvVar3[8] = (void *)0x0;
    ppvVar3[1] = (void *)0x0;
  }
  else {
    Mat::reshape(in_stack_fffffffffffffb18,in_stack_fffffffffffffb14,in_stack_fffffffffffffb10,
                 in_stack_fffffffffffffb0c,in_stack_fffffffffffffb00);
    Mat::create(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08,
                (size_t)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
    for (local_434 = 0; _c = (int)((ulong)in_stack_fffffffffffffa10 >> 0x20), local_434 < local_320;
        local_434 = local_434 + 1) {
      local_e0 = &local_390;
      local_e4 = local_434;
      local_440 = (undefined4 *)((long)local_390 + (long)local_364 * (long)local_434 * local_380);
      for (local_444 = 0; local_444 + local_348 + -1 < local_31c; local_444 = local_348 + local_444)
      {
        for (local_448 = 0; local_448 < local_32c; local_448 = local_448 + 1) {
          for (local_44c = 0; local_44c < local_348; local_44c = local_44c + 1) {
            local_188 = &local_4a0;
            local_190 = &local_430;
            local_78 = (void *)((long)local_430 + local_3f0 * local_434 * local_420);
            local_60 = &local_4a0;
            local_8 = (long)local_404 * (long)local_400 * local_420;
            local_f4 = local_444 + local_44c;
            local_f0 = &local_4a0;
            local_458 = (void *)((long)local_78 + (long)local_404 * (long)local_f4 * local_420);
            local_2f0 = &local_4a0;
            local_c = 0x10;
            local_194 = local_434;
            local_195 = 1;
            local_4a0 = 0;
            local_478 = 0;
            local_46c = 0;
            local_460 = 0;
            local_498 = 0;
            *local_440 = *(undefined4 *)((long)local_458 + (long)local_448 * 4);
            local_440 = local_440 + 1;
            local_1f0 = local_2f0;
          }
        }
      }
    }
    ppvVar2 = &local_430;
    local_2e8 = ppvVar2;
    local_200 = ppvVar2;
    if (local_428 != (int *)0x0) {
      local_204 = 0xffffffff;
      LOCK();
      local_208 = *local_428;
      *local_428 = *local_428 + -1;
      UNLOCK();
      if (local_208 == 1) {
        if (local_410 == (long *)0x0) {
          if (local_430 != (void *)0x0) {
            free(local_430);
          }
        }
        else {
          (**(code **)(*local_410 + 0x18))(local_410,local_430);
        }
      }
    }
    *ppvVar2 = (void *)0x0;
    ppvVar2[2] = (void *)0x0;
    *(undefined4 *)(ppvVar2 + 3) = 0;
    *(undefined4 *)(ppvVar2 + 5) = 0;
    *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
    *(undefined4 *)(ppvVar2 + 6) = 0;
    *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
    *(undefined4 *)(ppvVar2 + 7) = 0;
    ppvVar2[8] = (void *)0x0;
    ppvVar2[1] = (void *)0x0;
  }
  Mat::create(in_stack_fffffffffffffa20,(int)((ulong)in_stack_fffffffffffffa18 >> 0x20),
              (int)in_stack_fffffffffffffa18,_c,
              CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
              in_stack_fffffffffffffa00);
  for (local_4a4 = 0; local_4a4 < local_344; local_4a4 = local_4a4 + 1) {
    local_4a8 = local_4a4 * local_338;
    local_4b0 = local_330 - local_4a8;
    piVar1 = std::min<int>(&local_4b0,&local_338);
    local_4ac = *piVar1;
    for (local_4b4 = 0; local_4b4 < local_334; local_4b4 = local_340[0] + local_4b4) {
      local_4bc = local_334 - local_4b4;
      piVar1 = std::min<int>(&local_4bc,local_340);
      local_4b8 = *piVar1;
      local_1c4 = local_4a8 / local_338;
      local_1b8 = &local_550;
      local_9c = *(int *)((long)local_318 + 0x2c);
      local_30 = (int)local_318[6];
      local_34 = *(undefined4 *)((long)local_318 + 0x34);
      local_40 = *local_318 + local_318[8] * (long)local_1c4 * local_318[2];
      local_b0 = local_318[2];
      local_b4 = (undefined4)local_318[3];
      plVar4 = (long *)local_318[4];
      local_28 = &local_550;
      local_18 = (long)local_9c * (long)local_30 * local_b0;
      local_d4 = local_4b4 / local_340[0];
      local_c8 = &local_508;
      local_d0 = &local_550;
      local_a8 = (void *)(local_40 + (long)local_9c * (long)local_d4 * local_b0);
      local_98 = &local_508;
      local_2d8 = &local_550;
      local_1c = 0x10;
      local_a0 = 1;
      local_d8 = 1;
      local_1c5 = 1;
      piVar1 = (int *)0x0;
      local_550 = 0;
      local_540 = 0;
      local_538 = 0;
      local_528 = 0;
      local_524 = 0;
      local_520 = 0;
      local_51c = 0;
      local_518 = 0;
      local_510 = 0;
      local_548 = 0;
      local_220 = local_2d8;
      local_c0 = plVar4;
      local_58 = plVar4;
      local_4c = local_b4;
      local_48 = local_b0;
      local_2c = local_9c;
      local_530 = plVar4;
      local_508 = local_a8;
      convolution_im2col_pack_A_tile
                ((Mat *)weight_data_r2._48_8_,(Mat *)weight_data_r2._40_8_,
                 weight_data_r2.allocator._4_4_,(int)weight_data_r2.allocator,weight_data_r2._28_4_,
                 weight_data_r2.elempack);
      ppvVar2 = &local_508;
      local_2c8 = ppvVar2;
      local_240 = ppvVar2;
      if (piVar1 != (int *)0x0) {
        local_244 = 0xffffffff;
        LOCK();
        local_248 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_248 == 1) {
          if (plVar4 == (long *)0x0) {
            local_120 = local_508;
            if (local_508 != (void *)0x0) {
              free(local_508);
            }
          }
          else {
            (**(code **)(*plVar4 + 0x18))(plVar4,local_508);
          }
        }
      }
      *ppvVar2 = (void *)0x0;
      ppvVar2[2] = (void *)0x0;
      *(undefined4 *)(ppvVar2 + 3) = 0;
      *(undefined4 *)(ppvVar2 + 5) = 0;
      *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
      *(undefined4 *)(ppvVar2 + 6) = 0;
      *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
      *(undefined4 *)(ppvVar2 + 7) = 0;
      ppvVar2[8] = (void *)0x0;
      ppvVar2[1] = (void *)0x0;
    }
  }
  ppvVar2 = &local_390;
  if (local_388 != (int *)0x0) {
    local_264 = 0xffffffff;
    LOCK();
    local_268 = *local_388;
    *local_388 = *local_388 + -1;
    UNLOCK();
    if (local_268 == 1) {
      local_2b8 = ppvVar2;
      local_260 = ppvVar2;
      if (local_370 == (long *)0x0) {
        local_110 = local_390;
        if (local_390 != (void *)0x0) {
          free(local_390);
        }
      }
      else {
        (**(code **)(*local_370 + 0x18))(local_370,local_390);
      }
    }
  }
  *ppvVar2 = (void *)0x0;
  ppvVar2[2] = (void *)0x0;
  *(undefined4 *)(ppvVar2 + 3) = 0;
  *(undefined4 *)(ppvVar2 + 5) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
  *(undefined4 *)(ppvVar2 + 6) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
  *(undefined4 *)(ppvVar2 + 7) = 0;
  ppvVar2[8] = (void *)0x0;
  ppvVar2[1] = (void *)0x0;
  return;
}

Assistant:

static void convolution_im2col_gemm_transform_kernel(const Mat& kernel, Mat& AT, int inch, int outch, int kernel_w, int kernel_h, const Option& opt)
{
    // NCNN_LOGE("convolution_im2col_gemm_transform_kernel");
    const int maxk = kernel_w * kernel_h;

    const int M = outch;
    const int K = inch * maxk;

    int TILE_M, TILE_N, TILE_K;
    convolution_im2col_gemm_get_optimal_tile_mnk(M, 0, K, TILE_M, TILE_N, TILE_K, opt.num_threads);

    const int nn_M = (M + TILE_M - 1) / TILE_M;

    int elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = inch % 16 == 0 ? 16 : inch % 8 == 0 ? 8 : inch % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = inch % 8 == 0 ? 8 : inch % 4 == 0 ? 4 : 1;
#else
        elempack = inch % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // maxk-inch-outch to pa-maxk-inch/pa-outch
    Mat A_data;
    if (maxk == 1)
    {
        A_data = kernel.reshape(maxk * inch, outch);
    }
    else
    {
        Mat weight_data_r2 = kernel.reshape(maxk, inch, outch);

        A_data.create(maxk * inch, outch);

        for (int q = 0; q < outch; q += 1)
        {
            float* g00 = A_data.row(q);

            for (int p = 0; p + (elempack - 1) < inch; p += elempack)
            {
                for (int k = 0; k < maxk; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        const float* k00 = weight_data_r2.channel(q).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }

    AT.create(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        const int max_ii = std::min((M - i), TILE_M);

        for (int k = 0; k < K; k += TILE_K)
        {
            const int max_kk = std::min((K - k), TILE_K);

            Mat AT_tile = AT.channel(i / TILE_M).row_range(k / TILE_K, 1);

            convolution_im2col_pack_A_tile(A_data, AT_tile, i, max_ii, k, max_kk);
        }
    }
}